

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<vector_realloc<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_realloc<unsigned_char_*,_16U> *buckets)

{
  undefined8 *puVar1;
  ushort uVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  uint j;
  long lVar6;
  size_t *psVar7;
  uchar **ppuVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint j_1;
  ulong n_00;
  uint i;
  uchar **ppuVar12;
  long lVar13;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar8 = strings;
      do {
        iVar5 = (int)n;
        n = (size_t)(iVar5 - 1);
        puVar3 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar12 = ppuVar8; strings < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          puVar4 = ppuVar12[-1];
          bVar10 = puVar4[depth];
          bVar11 = puVar3[depth];
          if ((bVar10 != 0) && (lVar6 = depth + 1, bVar10 == bVar11)) {
            do {
              bVar10 = puVar4[lVar6];
              bVar11 = puVar3[lVar6];
              if (bVar10 == 0) break;
              lVar6 = lVar6 + 1;
            } while (bVar10 == bVar11);
          }
          if (bVar10 <= bVar11) break;
          *ppuVar12 = puVar4;
        }
        *ppuVar12 = puVar3;
      } while (2 < iVar5);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      ppuVar8 = strings;
      do {
        lVar6 = 0;
        do {
          *(uchar *)((long)local_238 + lVar6) = ppuVar8[lVar6][depth];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        lVar6 = 0;
        ppuVar12 = ppuVar8;
        do {
          vector_realloc<unsigned_char_*,_16U>::push_back
                    (buckets + *(byte *)((long)local_238 + lVar6),ppuVar12);
          lVar6 = lVar6 + 1;
          ppuVar12 = ppuVar12 + 1;
        } while (lVar6 != 0x20);
        uVar9 = uVar9 + 0x20;
        ppuVar8 = ppuVar8 + 0x20;
      } while (uVar9 < (n & 0xffffffffffffffe0));
    }
    lVar6 = n - uVar9;
    if (uVar9 <= n && lVar6 != 0) {
      ppuVar8 = strings + uVar9;
      do {
        vector_realloc<unsigned_char_*,_16U>::push_back(buckets + (*ppuVar8)[depth],ppuVar8);
        ppuVar8 = ppuVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    psVar7 = &buckets->_size;
    lVar6 = 0;
    do {
      local_238[lVar6] = (ushort)*psVar7;
      lVar6 = lVar6 + 1;
      psVar7 = psVar7 + 3;
    } while (lVar6 != 0x100);
    psVar7 = &buckets->_size;
    lVar6 = 0;
    lVar13 = 0;
    do {
      uVar2 = local_238[lVar6];
      if ((ulong)uVar2 != 0) {
        if (*psVar7 != 0) {
          memmove(strings + lVar13,((vector_realloc<unsigned_char_*,_16U> *)(psVar7 + -1))->_data,
                  *psVar7 << 3);
        }
        lVar13 = lVar13 + (ulong)uVar2;
      }
      lVar6 = lVar6 + 1;
      psVar7 = psVar7 + 3;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    do {
      free(*(void **)((long)&buckets->_data + lVar6));
      puVar1 = (undefined8 *)((long)&buckets->_data + lVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&buckets->_capacity + lVar6) = 0;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x1800);
    uVar9 = (ulong)local_238[0];
    lVar6 = 1;
    do {
      n_00 = (ulong)local_238[lVar6];
      if (n_00 != 0) {
        msd_D<vector_realloc<unsigned_char*,16u>,unsigned_short>
                  (strings + uVar9,n_00,depth + 1,buckets);
        uVar9 = uVar9 + n_00;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}